

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem_p.h
# Opt level: O3

bool qt_closestItemFirst(QGraphicsItem *item1,QGraphicsItem *item2)

{
  qreal *pqVar1;
  double dVar2;
  QGraphicsItem *pQVar3;
  QGraphicsItem *pQVar4;
  int iVar5;
  QGraphicsItemPrivate *pQVar6;
  QGraphicsItemPrivate *pQVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  
  pQVar6 = (item1->d_ptr).d;
  pQVar7 = (item2->d_ptr).d;
  if (pQVar6->parent != pQVar7->parent) {
    iVar8 = pQVar6->itemDepth;
    if (iVar8 == -1) {
      QGraphicsItemPrivate::resolveDepth(pQVar6);
      iVar8 = pQVar6->itemDepth;
    }
    iVar5 = pQVar7->itemDepth;
    pQVar4 = item1;
    iVar9 = iVar8;
    if (iVar5 == -1) {
      QGraphicsItemPrivate::resolveDepth(pQVar7);
      iVar5 = pQVar7->itemDepth;
    }
    for (; iVar5 < iVar8; iVar8 = iVar8 + -1) {
      pQVar6 = (pQVar4->d_ptr).d;
      pQVar3 = pQVar6->parent;
      iVar9 = iVar8;
      if (pQVar3 == (QGraphicsItem *)0x0) break;
      if (pQVar3 == item2) {
        return (*(ulong *)&pQVar6->field_0x160 & 0x10000000000) == 0;
      }
      pQVar4 = pQVar3;
      iVar9 = iVar5;
    }
    do {
      if (iVar5 <= iVar9) goto LAB_005ec8f3;
      pQVar6 = (item2->d_ptr).d;
      pQVar3 = pQVar6->parent;
      if (pQVar3 == (QGraphicsItem *)0x0) goto LAB_005ec8f3;
      if (pQVar3 == item1) {
        uVar10 = *(ulong *)&pQVar6->field_0x160 & 0x10000000000;
        goto LAB_005ec95d;
      }
      iVar5 = iVar5 + -1;
      item2 = pQVar3;
    } while( true );
  }
  uVar10 = *(ulong *)&pQVar7->field_0x160 & 0x10000000000;
  if (((uint)((ulong)*(undefined8 *)&pQVar6->field_0x160 >> 0x28) & 1) != (uint)(uVar10 >> 0x28))
  goto LAB_005ec95d;
  dVar2 = pQVar6->z;
  pqVar1 = &pQVar7->z;
  bVar11 = dVar2 == *pqVar1;
  bVar12 = dVar2 < *pqVar1;
  if ((bVar11) && (!NAN(dVar2) && !NAN(*pqVar1))) {
    iVar5 = pQVar6->siblingIndex;
    iVar8 = pQVar7->siblingIndex;
    bVar12 = SBORROW4(iVar5,iVar8);
    iVar9 = iVar5 - iVar8;
    bVar11 = iVar5 == iVar8;
LAB_005ec983:
    return !bVar11 && bVar12 == iVar9 < 0;
  }
  goto LAB_005ec955;
LAB_005ec8f3:
  if ((pQVar4 == (QGraphicsItem *)0x0) || (pQVar4 == item2)) {
    pQVar6 = (pQVar4->d_ptr).d;
    pQVar7 = (item2->d_ptr).d;
  }
  else {
    do {
      pQVar6 = (pQVar4->d_ptr).d;
      pQVar4 = pQVar6->parent;
      pQVar7 = (item2->d_ptr).d;
      if (pQVar4 == (QGraphicsItem *)0x0) break;
      item2 = pQVar7->parent;
    } while (pQVar4 != item2);
  }
  uVar10 = *(ulong *)&pQVar7->field_0x160 & 0x10000000000;
  if (((uint)((ulong)*(undefined8 *)&pQVar6->field_0x160 >> 0x28) & 1) != (uint)(uVar10 >> 0x28)) {
LAB_005ec95d:
    return uVar10 != 0;
  }
  dVar2 = pQVar6->z;
  pqVar1 = &pQVar7->z;
  bVar11 = dVar2 == *pqVar1;
  bVar12 = dVar2 < *pqVar1;
  if ((bVar11) && (!NAN(dVar2) && !NAN(*pqVar1))) {
    iVar5 = pQVar6->siblingIndex;
    iVar8 = pQVar7->siblingIndex;
    bVar12 = SBORROW4(iVar5,iVar8);
    iVar9 = iVar5 - iVar8;
    bVar11 = iVar5 == iVar8;
    goto LAB_005ec983;
  }
LAB_005ec955:
  return !bVar12 && !bVar11;
}

Assistant:

inline bool qt_closestItemFirst(const QGraphicsItem *item1, const QGraphicsItem *item2)
{
    // Siblings? Just check their z-values.
    const QGraphicsItemPrivate *d1 = item1->d_ptr.data();
    const QGraphicsItemPrivate *d2 = item2->d_ptr.data();
    if (d1->parent == d2->parent)
        return qt_closestLeaf(item1, item2);

    // Find common ancestor, and each item's ancestor closest to the common
    // ancestor.
    int item1Depth = d1->depth();
    int item2Depth = d2->depth();
    const QGraphicsItem *p = item1;
    const QGraphicsItem *t1 = item1;
    while (item1Depth > item2Depth && (p = p->d_ptr->parent)) {
        if (p == item2) {
            // item2 is one of item1's ancestors; item1 is on top
            return !(t1->d_ptr->flags & QGraphicsItem::ItemStacksBehindParent);
        }
        t1 = p;
        --item1Depth;
    }
    p = item2;
    const QGraphicsItem *t2 = item2;
    while (item2Depth > item1Depth && (p = p->d_ptr->parent)) {
        if (p == item1) {
            // item1 is one of item2's ancestors; item1 is not on top
            return (t2->d_ptr->flags & QGraphicsItem::ItemStacksBehindParent);
        }
        t2 = p;
        --item2Depth;
    }

    // item1Ancestor is now at the same level as item2Ancestor, but not the same.
    const QGraphicsItem *p1 = t1;
    const QGraphicsItem *p2 = t2;
    while (t1 && t1 != t2) {
        p1 = t1;
        p2 = t2;
        t1 = t1->d_ptr->parent;
        t2 = t2->d_ptr->parent;
    }

    // in case we have a common ancestor, we compare the immediate children in the ancestor's path.
    // otherwise we compare the respective items' topLevelItems directly.
    return qt_closestLeaf(p1, p2);
}